

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spoa_test.cpp
# Opt level: O3

void __thiscall
spoa::test::SpoaAlignmentTest_LargeInput_Test::TestBody(SpoaAlignmentTest_LargeInput_Test *this)

{
  AlignmentEngine local_50 [3];
  
  AlignmentEngine::Create(local_50,kSW,'\x01',-1,-1);
  (**(code **)(*local_50[0]._vptr_AlignmentEngine + 0x10))
            (local_50[0]._vptr_AlignmentEngine,0xffffffff,1);
  if (local_50[0]._vptr_AlignmentEngine != (_func_int **)0x0) {
    (**(code **)(*local_50[0]._vptr_AlignmentEngine + 8))();
  }
  return;
}

Assistant:

TEST(SpoaAlignmentTest, LargeInput) {
  auto ae = AlignmentEngine::Create(AlignmentType::kSW, 1, -1, -1);
  try {
    ae->Prealloc(-1, 1);
  } catch (std::invalid_argument& exception) {
    EXPECT_EQ(
        std::string(exception.what()).substr(11),
        "AlignmentEngine::Prealloc] error: too large sequence!");
  }
}